

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::ConfigBase::to_config
          (string *__return_storage_ptr__,ConfigBase *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  pointer pcVar1;
  Option *this_00;
  size_t __n;
  size_type sVar2;
  App *subcom;
  App *pAVar3;
  size_type sVar4;
  string *psVar5;
  byte bVar6;
  int iVar7;
  ostream *poVar8;
  pointer ppOVar9;
  App *pAVar10;
  long *plVar11;
  undefined7 in_register_00000009;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  _Alloc_hider _Var15;
  undefined8 uVar16;
  undefined7 in_register_00000081;
  byte bVar17;
  pointer ppOVar18;
  pointer __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  bool bVar20;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string value;
  string commentLead;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  _Any_data local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  byte local_349;
  uint local_348;
  uint local_344;
  App *local_340;
  undefined1 local_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined8 local_2f8;
  string *local_2f0;
  ConfigBase *local_2e8;
  string local_2e0;
  string local_2c0;
  long *local_2a0;
  long local_298;
  long local_290;
  undefined4 uStack_288;
  undefined4 uStack_284;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  _Any_data local_258;
  code *local_248;
  undefined8 uStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string local_210;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_1f0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_344 = (uint)CONCAT71(in_register_00000081,write_description);
  local_348 = (uint)CONCAT71(in_register_00000009,default_also);
  local_340 = app;
  local_2f0 = prefix;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_2e8 = this;
  ::std::__cxx11::string::push_back((char)&local_2e0);
  ::std::__cxx11::string::push_back((char)&local_2e0);
  App::get_groups_abi_cxx11_(&local_280,local_340);
  pbVar14 = local_280.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_378._M_unused._M_object = &local_368;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Options","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_280,(const_iterator)pbVar14,(value_type *)&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_unused._0_8_ != &local_368) {
    operator_delete(local_378._M_unused._M_object);
  }
  if ((char)local_344 != '\0') {
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
    pcVar1 = (local_340->description_)._M_dataplus._M_p;
    local_378._M_unused._M_object = &local_368;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_378,pcVar1,pcVar1 + (local_340->description_)._M_string_length);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
    local_318._M_local_buf[0] = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_318._M_local_buf,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_unused._0_8_ != &local_368) {
      operator_delete(local_378._M_unused._M_object);
    }
  }
  local_268 = __return_storage_ptr__;
  if (local_280.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_280.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_260 = local_280.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar14 = local_280.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar19 = local_280.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar17 = 0;
    do {
      iVar7 = ::std::__cxx11::string::compare((char *)pbVar14);
      if (iVar7 == 0) {
        bVar6 = 1;
        if ((bVar17 & 1) == 0) goto LAB_0010a72f;
      }
      else {
        bVar20 = pbVar14->_M_string_length == 0;
        bVar6 = 1;
        if ((bVar20 & bVar17) == 0) {
          bVar6 = bVar20 | bVar17;
LAB_0010a72f:
          if ((((char)local_344 != '\0') &&
              (iVar7 = ::std::__cxx11::string::compare((char *)pbVar14), iVar7 != 0)) &&
             (pbVar14->_M_string_length != 0)) {
            local_378._M_pod_data[0] = 10;
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_378._M_pod_data,1);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," Options\n",9);
          }
          local_258._M_unused._M_object = (void *)0x0;
          local_258._8_8_ = 0;
          local_248 = (code *)0x0;
          uStack_240 = 0;
          App::get_options(&local_1f0,local_340,(function<bool_(const_CLI::Option_*)> *)&local_258);
          local_349 = bVar6;
          if (local_248 != (code *)0x0) {
            (*local_248)(&local_258,&local_258,__destroy_functor);
          }
          local_2f8 = local_1f0.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          ppOVar9 = local_1f0.
                    super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          ppOVar18 = local_1f0.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (local_1f0.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f0.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              this_00 = *ppOVar18;
              __rhs = (this_00->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
              if ((__rhs != (this_00->lnames_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) &&
                 ((this_00->super_OptionBase<CLI::Option>).configurable_ == true)) {
                __n = (this_00->super_OptionBase<CLI::Option>).group_._M_string_length;
                if ((__n != pbVar14->_M_string_length) ||
                   ((__n != 0 &&
                    (iVar7 = bcmp((this_00->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p,
                                  (pbVar14->_M_dataplus)._M_p,__n), iVar7 != 0)))) {
                  iVar7 = ::std::__cxx11::string::compare((char *)pbVar14);
                  ppOVar9 = local_2f8;
                  if ((iVar7 != 0) ||
                     ((this_00->super_OptionBase<CLI::Option>).group_._M_string_length != 0))
                  goto LAB_0010ab5e;
                  __rhs = (this_00->lnames_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                }
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_378,local_2f0,__rhs);
                Option::reduced_results_abi_cxx11_((results_t *)local_338,this_00);
                detail::ini_join((string *)&local_318,(results_t *)local_338,
                                 local_2e8->arraySeparator,local_2e8->arrayStart,local_2e8->arrayEnd
                                );
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((results_t *)local_338);
                if ((char)local_348 == '\x01' && (char *)local_318._8_8_ == (char *)0x0) {
                  pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
                  local_338._0_8_ = (pointer)(local_338 + 0x10);
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_338,pcVar1,
                             pcVar1 + (this_00->default_str_)._M_string_length);
                  uVar16 = local_338._8_8_;
                  if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                    operator_delete((void *)local_338._0_8_);
                  }
                  if ((pointer)uVar16 == (pointer)0x0) {
                    if (this_00->expected_min_ == 0) {
                      ::std::__cxx11::string::_M_replace
                                ((ulong)&local_318,0,(char *)local_318._8_8_,0x1400be);
                    }
                  }
                  else {
                    pcVar1 = (this_00->default_str_)._M_dataplus._M_p;
                    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_2c0,pcVar1,
                               pcVar1 + (this_00->default_str_)._M_string_length);
                    detail::convert_arg_for_ini((string *)local_338,&local_2c0);
                    ::std::__cxx11::string::operator=
                              ((string *)local_318._M_local_buf,(string *)local_338);
                    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                      operator_delete((void *)local_338._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                      operator_delete(local_2c0._M_dataplus._M_p);
                    }
                  }
                }
                if ((char *)local_318._8_8_ != (char *)0x0) {
                  if (((char)local_344 != '\0') && ((this_00->description_)._M_string_length != 0))
                  {
                    local_338[0] = (string)0xa;
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_338,1);
                    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       (local_1a8,local_2e0._M_dataplus._M_p,
                                        local_2e0._M_string_length);
                    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                    pcVar1 = (this_00->description_)._M_dataplus._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_210,pcVar1,
                               pcVar1 + (this_00->description_)._M_string_length);
                    detail::fix_newlines((string *)local_338,&local_2e0,&local_210);
                    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,(char *)local_338._0_8_,local_338._8_8_);
                    local_2c0._M_dataplus._M_p._0_1_ = 10;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,(char *)&local_2c0,1);
                    if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                      operator_delete((void *)local_338._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_210._M_dataplus._M_p != &local_210.field_2) {
                      operator_delete(local_210._M_dataplus._M_p);
                    }
                  }
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     (local_1a8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
                  local_338[0] = (string)local_2e8->valueDelimiter;
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_338,1);
                  poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar8,(char *)local_318._M_allocated_capacity,local_318._8_8_
                                     );
                  local_338[0] = (string)0xa;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_338,1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_allocated_capacity != &local_308) {
                  operator_delete((void *)local_318._M_allocated_capacity);
                }
                ppOVar9 = local_2f8;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_unused._0_8_ != &local_368) {
                  operator_delete(local_378._M_unused._M_object);
                  ppOVar9 = local_2f8;
                }
              }
LAB_0010ab5e:
              ppOVar18 = ppOVar18 + 1;
            } while (ppOVar18 != ppOVar9);
          }
          pbVar19 = local_260;
          bVar6 = local_349;
          if (local_1f0.
              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1f0.
                            super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            pbVar19 = local_260;
            bVar6 = local_349;
          }
        }
      }
      pbVar14 = pbVar14 + 1;
      bVar17 = bVar6;
    } while (pbVar14 != pbVar19);
  }
  local_368._M_allocated_capacity = 0;
  local_368._8_8_ = 0;
  local_378._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_378._8_8_ = 0;
  App::get_subcommands
            ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)&local_2c0,local_340,
             (function<bool_(const_CLI::App_*)> *)&local_378);
  if ((code *)local_368._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_368._M_allocated_capacity)(&local_378,&local_378,3);
  }
  sVar4 = local_2c0._M_string_length;
  if (local_2c0._M_dataplus._M_p != (pointer)local_2c0._M_string_length) {
    local_2f8 = (pointer)(CONCAT44(local_2f8._4_4_,local_348) & 0xffffffff000000ff);
    local_348 = local_344 & 0xff;
    _Var15._M_p = local_2c0._M_dataplus._M_p;
    do {
      sVar2 = *(size_type *)_Var15._M_p;
      if (*(long *)(sVar2 + 0x10) == 0) {
        if (((char)local_344 != '\0') && (*(long *)(sVar2 + 0x2d0) != 0)) {
          local_378._M_pod_data[0] = 10;
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,local_378._M_pod_data,1);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,*(char **)(sVar2 + 0x2c8),*(long *)(sVar2 + 0x2d0));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," Options\n",9);
        }
        pcVar1 = (local_2f0->_M_dataplus)._M_p;
        local_1d8[0] = local_1c8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,pcVar1,pcVar1 + local_2f0->_M_string_length);
        (**(local_2e8->super_Config)._vptr_Config)
                  (&local_378,local_2e8,sVar2,(ulong)local_2f8 & 0xffffffff,(ulong)local_348,
                   (string *)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_unused._0_8_ != &local_368) {
          operator_delete(local_378._M_unused._M_object);
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0]);
        }
      }
      _Var15._M_p = _Var15._M_p + 8;
    } while (_Var15._M_p != (pointer)sVar4);
    if (local_2c0._M_dataplus._M_p != (pointer)local_2c0._M_string_length) {
      _Var15._M_p = local_2c0._M_dataplus._M_p;
      do {
        subcom = *(App **)_Var15._M_p;
        if ((subcom->name_)._M_string_length != 0) {
          if ((subcom->configurable_ == true) &&
             (pAVar10 = App::get_subcommand(local_340,subcom), pAVar10->parsed_ != 0)) {
            if ((local_2f0->_M_string_length == 0) && (local_340->parent_ != (App *)0x0)) {
              pcVar1 = (local_340->name_)._M_dataplus._M_p;
              local_318._M_allocated_capacity = (size_type)&local_308;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_318,pcVar1,pcVar1 + (local_340->name_)._M_string_length);
              ::std::__cxx11::string::append(local_318._M_local_buf);
              plVar11 = (long *)::std::__cxx11::string::_M_append
                                          (local_318._M_local_buf,
                                           (ulong)(subcom->name_)._M_dataplus._M_p);
              local_378._M_unused._M_object = &local_368;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar13) {
                local_368._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_368._8_8_ = plVar11[3];
              }
              else {
                local_368._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_378._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar11;
              }
              local_378._8_8_ = plVar11[1];
              *plVar11 = (long)paVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_allocated_capacity != &local_308) {
                operator_delete((void *)local_318._M_allocated_capacity);
              }
              pAVar10 = local_340->parent_;
              pAVar3 = pAVar10->parent_;
              while (pAVar3 != (App *)0x0) {
                local_338._0_8_ = local_338 + 0x10;
                pcVar1 = (pAVar10->name_)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_338,pcVar1,pcVar1 + (pAVar10->name_)._M_string_length);
                ::std::__cxx11::string::append((char *)local_338);
                plVar11 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_338,local_378._M_unused._M_member_pointer
                                            );
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar13) {
                  local_308._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_308._8_8_ = plVar11[3];
                  local_318._M_allocated_capacity = (size_type)&local_308;
                }
                else {
                  local_308._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_318._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_318._8_8_ = plVar11[1];
                *plVar11 = (long)paVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                ::std::__cxx11::string::operator=
                          ((string *)local_378._M_pod_data,(string *)local_318._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._M_allocated_capacity != &local_308) {
                  operator_delete((void *)local_318._M_allocated_capacity);
                }
                if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
                  operator_delete((void *)local_338._0_8_);
                }
                pAVar10 = pAVar10->parent_;
                pAVar3 = pAVar10->parent_;
              }
              local_318._M_allocated_capacity._1_7_ =
                   (undefined7)(local_318._M_allocated_capacity >> 8);
              local_318._M_local_buf[0] = 0x5b;
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,local_318._M_local_buf,1);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]\n",2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_unused._0_8_ != &local_368) {
                operator_delete(local_378._M_unused._M_object);
              }
            }
            else {
              local_378._M_pod_data[0] = 0x5b;
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,local_378._M_pod_data,1);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_2f0->_M_dataplus)._M_p,local_2f0->_M_string_length);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(subcom->name_)._M_dataplus._M_p,
                                  (subcom->name_)._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]\n",2);
            }
            local_230[0] = &local_220;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
            (**(local_2e8->super_Config)._vptr_Config)
                      (&local_378,local_2e8,subcom,(ulong)local_2f8 & 0xffffffff,(ulong)local_348,
                       (string *)local_230);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_unused._0_8_ != &local_368) {
              operator_delete(local_378._M_unused._M_object);
            }
            uVar16 = local_230[0];
            if (local_230[0] != &local_220) {
LAB_0010af5f:
              operator_delete((void *)uVar16);
            }
          }
          else {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_318,local_2f0,&subcom->name_);
            plVar11 = (long *)::std::__cxx11::string::append(local_318._M_local_buf);
            local_2a0 = &local_290;
            plVar12 = plVar11 + 2;
            if ((long *)*plVar11 == plVar12) {
              local_290 = *plVar12;
              uStack_288 = (undefined4)plVar11[3];
              uStack_284 = *(undefined4 *)((long)plVar11 + 0x1c);
            }
            else {
              local_290 = *plVar12;
              local_2a0 = (long *)*plVar11;
            }
            local_298 = plVar11[1];
            *plVar11 = (long)plVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            (**(local_2e8->super_Config)._vptr_Config)
                      (&local_378,local_2e8,subcom,(ulong)local_2f8 & 0xffffffff,(ulong)local_348,
                       &local_2a0);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_378._M_unused._0_8_,local_378._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_unused._0_8_ != &local_368) {
              operator_delete(local_378._M_unused._M_object);
            }
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0);
            }
            uVar16 = local_318._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_allocated_capacity != &local_308) goto LAB_0010af5f;
          }
        }
        _Var15._M_p = _Var15._M_p + 8;
      } while (_Var15._M_p != (pointer)local_2c0._M_string_length);
    }
  }
  psVar5 = local_268;
  ::std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

inline std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("Options"));
    if(write_description) {
        out << commentLead << app->get_description() << '\n';
    }
    for(auto &group : groups) {
        if(group == "Options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "Options" && !group.empty()) {
            out << '\n' << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {

            // Only process option with a long-name and configurable
            if(!opt->get_lnames().empty() && opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "Options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string name = prefix + opt->get_lnames()[0];
                std::string value = detail::ini_join(opt->reduced_results(), arraySeparator, arrayStart, arrayEnd);

                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str());
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    }
                }

                if(!value.empty()) {
                    if(write_description && opt->has_description()) {
                        out << '\n';
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }
    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(subcom->get_configurable() && app->got_subcommand(subcom)) {
                if(!prefix.empty() || app->get_parent() == nullptr) {
                    out << '[' << prefix << subcom->get_name() << "]\n";
                } else {
                    std::string subname = app->get_name() + "." + subcom->get_name();
                    auto p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        subname = p->get_name() + "." + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");
            }
        }
    }

    return out.str();
}